

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O1

char * json_escape(char *src)

{
  ulong uVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  long *plVar8;
  char *pcVar9;
  
  sVar7 = strlen(src);
  plVar8 = (long *)g_string_sized_new(sVar7);
  lVar4 = _g_utf8_skip;
  bVar2 = *src;
  do {
    if (bVar2 == 0) {
      pcVar9 = (char *)g_string_free(plVar8,0);
      return pcVar9;
    }
    uVar5 = g_utf8_get_char(src);
    if ((int)uVar5 < 0x22) {
      switch(uVar5) {
      case 8:
        pcVar9 = "\\b";
        break;
      case 9:
        pcVar9 = "\\t";
        break;
      case 10:
        pcVar9 = "\\n";
        break;
      case 0xb:
        pcVar9 = "\\v";
        break;
      case 0xc:
        pcVar9 = "\\f";
        break;
      case 0xd:
        pcVar9 = "\\r";
        break;
      default:
switchD_00106a41_default:
        iVar6 = g_unichar_isgraph(uVar5);
        if ((uVar5 == 0x20) || (iVar6 != 0)) {
          plVar8 = (long *)g_string_append_unichar(plVar8,uVar5);
        }
        else if (uVar5 < 0x10000) {
          g_string_append_printf(plVar8,"\\u%04X",uVar5);
        }
        else {
          g_string_append_printf
                    (plVar8,"\\u%04X\\u%04X",(uVar5 + 0x3ff0000 >> 10) + 0xd800 & 0xffff,
                     uVar5 & 0x3ff | 0xdc00);
        }
        goto LAB_00106b93;
      }
      plVar8 = (long *)g_string_append(plVar8,pcVar9);
    }
    else {
      if ((int)uVar5 < 0x2a) {
        if ((uVar5 != 0x22) && (uVar5 != 0x27)) goto switchD_00106a41_default;
LAB_00106a98:
        lVar3 = plVar8[1];
        uVar1 = lVar3 + 1;
        if (uVar1 < (ulong)plVar8[2]) {
          plVar8[1] = uVar1;
          *(undefined1 *)(*plVar8 + lVar3) = 0x5c;
          *(undefined1 *)(*plVar8 + plVar8[1]) = 0;
        }
        else {
          g_string_insert_c(plVar8,0xffffffffffffffff,0x5c);
        }
        lVar3 = plVar8[1];
        uVar1 = lVar3 + 1;
        if ((ulong)plVar8[2] <= uVar1) {
          iVar6 = (int)(char)uVar5;
LAB_00106b8e:
          g_string_insert_c(plVar8,0xffffffffffffffff,iVar6);
          goto LAB_00106b93;
        }
        plVar8[1] = uVar1;
        *(char *)(*plVar8 + lVar3) = (char)uVar5;
      }
      else {
        if (uVar5 == 0x5c) goto LAB_00106a98;
        if (uVar5 != 0x2a) goto switchD_00106a41_default;
        lVar3 = plVar8[1];
        uVar1 = lVar3 + 1;
        if ((ulong)plVar8[2] <= uVar1) {
          iVar6 = 0x5c;
          goto LAB_00106b8e;
        }
        plVar8[1] = uVar1;
        *(undefined1 *)(*plVar8 + lVar3) = 0x5c;
      }
      *(undefined1 *)(*plVar8 + plVar8[1]) = 0;
    }
LAB_00106b93:
    bVar2 = ((byte *)src)[*(char *)(lVar4 + (ulong)(byte)*src)];
    src = (char *)((byte *)src + *(char *)(lVar4 + (ulong)(byte)*src));
  } while( true );
}

Assistant:

char *
json_escape (const char *src)
{
    // TODO g_string_replace from glib 2.68 does it all

    char *p = (char *) src;
    GString *s = g_string_sized_new (strlen (src));

    while (*p) {
        gunichar c = g_utf8_get_char (p);
        switch (c)
        {
        // JSON does not need to escape asterisk. This is for
        // workaround in format template
        case '*' : s = g_string_append_c (s, '\\'); break;
        case '\\':
        // For all other chars below, they are actually disallowed
        // in Windows path. This is for the mischievous who
        // move data to other OS and rename
        case 0x22:
        case 0x27:
            s = g_string_append_c (s, '\\');
            s = g_string_append_c (s, c);
            break;
        case 0x08: s = g_string_append (s, "\\b"); break;
        case 0x09: s = g_string_append (s, "\\t"); break;
        case 0x0A: s = g_string_append (s, "\\n"); break;
        case 0x0B: s = g_string_append (s, "\\v"); break;
        case 0x0C: s = g_string_append (s, "\\f"); break;
        case 0x0D: s = g_string_append (s, "\\r"); break;
        default  :
            if (g_unichar_isgraph (c) || c == 0x20)
                s = g_string_append_unichar (s, c);
            else if (c < 0x10000)
                g_string_append_printf (s, "\\u%04X", c);
            else  // calculate surrogate
            {
                uint16_t high, low;
                high = 0xD800 + ((c - 0x10000) >> 10  );
                low  = 0xDC00 + ((c - 0x10000) & 0x3FF);
                g_string_append_printf (s, "\\u%04X\\u%04X", high, low);
            }
            break;
        }
        p = g_utf8_next_char (p);
    }
    return g_string_free (s, FALSE);
}